

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O1

_Bool oonf_layer2_neigh_cleanup(oonf_layer2_neigh *l2neigh,oonf_layer2_origin *origin)

{
  uint8_t *puVar1;
  _Bool _Var2;
  long lVar3;
  
  lVar3 = 0xd0;
  _Var2 = false;
  do {
    if (*(oonf_layer2_origin **)((l2neigh->key).addr._addr + lVar3) == origin) {
      puVar1 = (l2neigh->key).addr._addr + lVar3 + -8;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      puVar1[8] = '\0';
      puVar1[9] = '\0';
      puVar1[10] = '\0';
      puVar1[0xb] = '\0';
      puVar1[0xc] = '\0';
      puVar1[0xd] = '\0';
      puVar1[0xe] = '\0';
      puVar1[0xf] = '\0';
      _Var2 = true;
    }
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x4e0);
  return _Var2;
}

Assistant:

bool
oonf_layer2_neigh_cleanup(struct oonf_layer2_neigh *l2neigh, const struct oonf_layer2_origin *origin) {
  bool changed = false;
  int i;

  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (l2neigh->data[i]._origin == origin) {
      oonf_layer2_data_reset(&l2neigh->data[i]);
      changed = true;
    }
  }
  return changed;
}